

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)4>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _Bit_type *p_Var8;
  int iVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  size_type sVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  pointer pdVar22;
  long lVar23;
  _Bit_type *__first_p;
  MultiIndexSet *mset;
  ulong *puVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  pointer piVar28;
  long lVar29;
  long lVar30;
  size_type __n;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Data2D<double> vals;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> levels;
  vector<double,_std::allocator<double>_> norm;
  SplitDirections split;
  Data2D<int> dagUp;
  allocator_type local_201;
  double *local_200;
  pointer local_1f8;
  uint local_1ec;
  uint local_1e8;
  int local_1e4;
  double *local_1e0;
  long local_1d8;
  ulong local_1d0;
  pointer local_1c8;
  double *local_1c0;
  long local_1b8;
  size_t local_1b0;
  ulong local_1a8;
  int local_19c;
  vector<bool,_std::allocator<bool>_> local_198;
  long local_170;
  long local_168;
  vector<double,_std::allocator<double>_> local_160;
  vector<int,_std::allocator<int>_> local_148;
  long local_130;
  long local_128;
  vector<int,_std::allocator<int>_> local_120;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_e8;
  vector<double,_std::allocator<double>_> local_d0;
  SplitDirections local_b8;
  Data2D<int> *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  double local_60;
  Data2D<int> local_58;
  
  iVar9 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)iVar9;
  sVar13 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_58.stride = CONCAT44(local_58.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_1e0 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_b8.job_directions,sVar13 * __n,(value_type_conflict3 *)&local_58,
             (allocator_type *)&local_198);
  piVar28 = local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar13;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_1b0 = sVar13;
    local_88 = __return_storage_ptr__;
    getNormalization(&local_d0,this);
    local_1e8 = 1;
    if (output == -1) {
      local_1e8 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_1d8 = (long)(int)local_1e8;
    local_1c8 = (pointer)0x0;
    local_1c0 = (double *)0x0;
    if (local_1e0 == (double *)0x0) {
      local_58.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_b8,local_1d8 * __n,
                 (value_type_conflict2 *)&local_58,(allocator_type *)&local_198);
      local_1c8 = local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_1c0 = (double *)
                  local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1e0 = (double *)
                  local_b8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    auVar7 = _DAT_001ca0b0;
    auVar6 = _DAT_001ca070;
    auVar5 = _DAT_001ca060;
    if (criteria < refine_direction_selective) {
      sVar13 = local_1b0;
      if (0 < iVar9) {
        sVar3 = (this->surpluses).stride;
        pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar28 = (pointer)((long)piVar28 + 0xc);
        sVar18 = 0;
        do {
          lVar19 = sVar3 * sVar18;
          if (output == -1) {
            lVar23 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar23) {
              bVar14 = true;
              lVar29 = 0;
              do {
                while (bVar14) {
                  dVar31 = (ABS(pdVar4[lVar19 + lVar29]) * (local_1e0 + sVar18 * local_1d8)[lVar29])
                           / local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar29];
                  bVar14 = dVar31 <= tolerance;
                  lVar29 = lVar29 + 1;
                  if (lVar29 == lVar23) goto LAB_001a55c7;
                }
                lVar29 = lVar29 + 1;
                bVar14 = false;
              } while (lVar29 != lVar23);
              goto LAB_001a562a;
            }
          }
          else {
            dVar31 = (ABS(pdVar4[lVar19 + output]) * local_1e0[sVar18 * local_1d8]) /
                     local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output];
LAB_001a55c7:
            if (tolerance < dVar31) {
LAB_001a562a:
              lVar19 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
              if (0 < lVar19) {
                uVar20 = lVar19 + 0x3fffffffffffffff;
                uVar21 = uVar20 & 0x3fffffffffffffff;
                auVar32._8_4_ = (int)uVar21;
                auVar32._0_8_ = uVar21;
                auVar32._12_4_ = (int)(uVar21 >> 0x20);
                auVar32 = auVar32 ^ auVar5;
                lVar19 = 0;
                do {
                  auVar33._8_4_ = (int)lVar19;
                  auVar33._0_8_ = lVar19;
                  auVar33._12_4_ = (int)((ulong)lVar19 >> 0x20);
                  auVar34 = (auVar33 | auVar6) ^ auVar5;
                  iVar9 = auVar32._4_4_;
                  if ((bool)(~(iVar9 < auVar34._4_4_ ||
                              auVar32._0_4_ < auVar34._0_4_ && auVar34._4_4_ == iVar9) & 1)) {
                    piVar28[lVar19 + -3] = 1;
                  }
                  if (auVar34._12_4_ <= auVar32._12_4_ &&
                      (auVar34._8_4_ <= auVar32._8_4_ || auVar34._12_4_ != auVar32._12_4_)) {
                    piVar28[lVar19 + -2] = 1;
                  }
                  auVar33 = (auVar33 | auVar7) ^ auVar5;
                  iVar15 = auVar33._4_4_;
                  if (iVar15 <= iVar9 && (iVar15 != iVar9 || auVar33._0_4_ <= auVar32._0_4_)) {
                    piVar28[lVar19 + -1] = 1;
                    piVar28[lVar19] = 1;
                  }
                  lVar19 = lVar19 + 4;
                } while ((uVar21 - ((uint)uVar20 & 3)) + 4 != lVar19);
              }
            }
          }
          sVar18 = sVar18 + 1;
          piVar28 = piVar28 + local_1b0;
          sVar13 = local_1b0 * 4;
        } while (sVar18 != __n);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>(&local_58,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_b8,mset);
      iVar9 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_b8);
      ::std::vector<int,_std::allocator<int>_>::vector(&local_120,__n,(allocator_type *)&local_198);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_e8,(long)iVar9,(allocator_type *)&local_198);
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (ulong *)0x0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      ::std::vector<int,_std::allocator<int>_>::resize(&local_108,(long)this->top_level + 1);
      ::std::vector<int,_std::allocator<int>_>::resize(&local_148,(long)this->top_level + 1);
      std::vector<bool,_std::allocator<bool>_>::resize(&local_198,(long)iVar9,false);
      if (0 < (int)((ulong)((long)local_b8.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_b8.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_130 = (long)output;
        local_68 = (ulong)local_1e8;
        lVar19 = 0;
        local_200 = (double *)piVar28;
        do {
          iVar9 = *(int *)((long)local_b8.job_directions.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar19 * 4);
          lVar23 = (long)iVar9;
          local_1f8 = local_b8.job_pnts.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar19].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
          local_1d0 = (ulong)((long)local_b8.job_pnts.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar19].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)local_1f8) >> 2;
          local_170 = local_1d8;
          local_168 = (long)(int)local_1d0;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_160,local_168 * local_1d8,&local_201);
          piVar28 = local_1f8;
          uVar11 = (uint)local_1d0;
          if (output == -1) {
            if (0 < (int)uVar11) {
              uVar20 = 0;
              iVar15 = 0;
              local_1b8 = lVar19;
              do {
                lVar19 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (0 < lVar19) {
                  memmove(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + local_170 * uVar20,
                          (this->super_BaseCanonicalGrid).values.values.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)piVar28[uVar20] * (this->super_BaseCanonicalGrid).values.num_outputs
                          ,lVar19 << 3);
                }
                local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[piVar28[uVar20]] = (int)uVar20;
                iVar1 = (this->super_BaseCanonicalGrid).points.indexes.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(long)piVar28[uVar20] *
                         (this->super_BaseCanonicalGrid).points.num_dimensions + lVar23];
                iVar27 = 0;
                if ((1 < iVar1) && (iVar27 = 1, iVar1 != 2)) {
                  uVar16 = iVar1 - 1;
                  do {
                    uVar16 = (int)uVar16 >> 1;
                    iVar27 = iVar27 + 1;
                  } while (1 < uVar16);
                }
                local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20] = iVar27;
                if (iVar15 <= iVar27) {
                  iVar15 = iVar27;
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != (uVar11 & 0x7fffffff));
              goto LAB_001a5a9d;
            }
          }
          else if (0 < (int)uVar11) {
            sVar13 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            pdVar4 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar3 = (this->super_BaseCanonicalGrid).values.num_outputs;
            piVar28 = (this->super_BaseCanonicalGrid).points.indexes.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            uVar20 = 0;
            iVar15 = 0;
            do {
              iVar1 = local_1f8[uVar20];
              local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_170 * uVar20] =
                   pdVar4[local_130 + sVar3 * (long)iVar1];
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1] = (int)uVar20;
              iVar1 = piVar28[lVar23 + (long)local_1f8[uVar20] * sVar13];
              iVar27 = 0;
              if ((1 < iVar1) && (iVar27 = 1, iVar1 != 2)) {
                uVar16 = iVar1 - 1;
                do {
                  uVar16 = (int)uVar16 >> 1;
                  iVar27 = iVar27 + 1;
                } while (1 < uVar16);
              }
              local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar20] = iVar27;
              if (iVar15 <= iVar27) {
                iVar15 = iVar27;
              }
              uVar20 = uVar20 + 1;
              local_1b8 = lVar19;
            } while (uVar20 != (uVar11 & 0x7fffffff));
LAB_001a5a9d:
            uVar11 = (uint)local_1d0;
            if (0 < iVar15) {
              local_1e4 = iVar9 * 2;
              uVar16 = uVar11 & 0x7fffffff;
              local_80 = (ulong)(uVar16 >> 6);
              local_1ec = uVar11 & 0x3f;
              local_78 = (ulong)((uVar16 >> 6) << 3);
              local_70 = ~(0xffffffffffffffffU >> (-(char)local_1ec & 0x3fU));
              iVar9 = iVar9 * 2 + 2;
              local_1a8 = 1;
              local_19c = iVar15;
              do {
                if (0 < (int)local_1d0) {
                  local_128 = 0;
                  uVar20 = 0;
                  do {
                    piVar28 = local_1f8;
                    if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar20] == (int)local_1a8) {
                      local_60 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)4>
                                           ((this->super_BaseCanonicalGrid).points.indexes.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start
                                            [(long)local_1f8[uVar20] *
                                             (this->super_BaseCanonicalGrid).points.num_dimensions +
                                             lVar23]);
                      pdVar4 = local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start;
                      lVar19 = local_170;
                      p_Var8 = local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                      *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start = local_1e4;
                      *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start = piVar28[uVar20];
                      if (uVar16 < 0x40) {
                        puVar24 = local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                        if (local_1ec != 0) {
LAB_001a5be2:
                          *puVar24 = *puVar24 & local_70;
                        }
                      }
                      else {
                        memset(local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                               local_78);
                        if (local_1ec != 0) {
                          puVar24 = p_Var8 + local_80;
                          goto LAB_001a5be2;
                        }
                      }
                      if (*local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start < iVar9) {
                        lVar19 = lVar19 * local_128;
                        iVar15 = 0;
                        piVar10 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        do {
                          iVar1 = piVar10[iVar15];
                          if (iVar1 < iVar9) {
                            iVar27 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start
                                     [(long)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start[iVar15] *
                                      local_58.stride + (long)iVar1];
                            lVar29 = (long)iVar27;
                            if (lVar29 != -1) {
                              iVar2 = local_120.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar29];
                              uVar21 = (ulong)iVar2;
                              iVar17 = iVar2 + 0x3f;
                              if (-1 < (long)uVar21) {
                                iVar17 = iVar2;
                              }
                              if ((local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                   [(long)(iVar17 >> 6) +
                                    ((ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) - 1
                                    )] >> (uVar21 & 0x3f) & 1) == 0) {
                                dVar31 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>
                                                   (this->order,
                                                    (this->super_BaseCanonicalGrid).points.indexes.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start
                                                    [(this->super_BaseCanonicalGrid).points.
                                                     num_dimensions * lVar29 + lVar23],local_60);
                                iVar1 = local_120.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[lVar29];
                                uVar21 = (ulong)iVar1;
                                if (0 < (int)local_1e8) {
                                  uVar12 = 0;
                                  do {
                                    *(double *)((long)pdVar4 + uVar12 * 8 + lVar19) =
                                         local_160.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start
                                         [local_170 * uVar21 + uVar12] * -dVar31 +
                                         *(double *)((long)pdVar4 + uVar12 * 8 + lVar19);
                                    uVar12 = uVar12 + 1;
                                  } while (local_68 != uVar12);
                                }
                                uVar12 = uVar21 + 0x3f;
                                if (-1 < (long)uVar21) {
                                  uVar12 = uVar21;
                                }
                                local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                [((long)uVar12 >> 6) +
                                 ((ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                                     = local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p[((long)uVar12 >> 6) +
                                            ((ulong)((uVar21 & 0x800000000000003f) <
                                                    0x8000000000000001) - 1)] |
                                       1L << ((byte)iVar1 & 0x3f);
                                local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[(long)iVar15 + 1] = local_1e4;
                                local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[(long)iVar15 + 1] = iVar27;
                                piVar10 = local_108.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start;
                                iVar15 = iVar15 + 1;
                                goto LAB_001a5ca6;
                              }
                            }
                            piVar10[iVar15] = iVar1 + 1;
                          }
                          else {
                            piVar10[(long)iVar15 + -1] = piVar10[(long)iVar15 + -1] + 1;
                            iVar15 = iVar15 + -1;
                          }
LAB_001a5ca6:
                        } while (*piVar10 < iVar9);
                      }
                    }
                    uVar20 = uVar20 + 1;
                    local_128 = local_128 + 8;
                  } while (uVar20 != uVar16);
                }
                iVar15 = (int)local_1a8;
                local_1a8 = (ulong)(iVar15 + 1);
                uVar11 = (uint)local_1d0;
              } while (iVar15 != local_19c);
            }
            lVar19 = local_1b8;
            if (0 < (int)uVar11) {
              sVar13 = (this->surpluses).stride;
              pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar20 = 0;
              pdVar22 = local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                lVar29 = (long)local_1f8[uVar20];
                lVar30 = sVar13 * lVar29;
                if (output == -1) {
                  lVar25 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                  bVar14 = true;
                  if (0 < lVar25) {
                    lVar26 = 0;
                    do {
                      if (bVar14 == false) {
                        bVar14 = false;
                      }
                      else {
                        dVar31 = (local_1e0 + lVar29 * local_1d8)[lVar26];
                        bVar14 = true;
                        if (tolerance <
                            (ABS(pdVar4[lVar30 + lVar26]) * dVar31) /
                            local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar26]) {
                          bVar14 = (dVar31 * ABS(pdVar22[lVar26])) /
                                   local_d0.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar26] <= tolerance;
                        }
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar25 != lVar26);
                  }
                }
                else {
                  dVar31 = local_1e0[lVar29 * local_1d8];
                  bVar14 = true;
                  if (tolerance <
                      (ABS(pdVar4[lVar30 + local_130]) * dVar31) /
                      local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_130]) {
                    bVar14 = (dVar31 * ABS(local_160.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [local_170 * uVar20])) /
                             local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[local_130] <= tolerance;
                  }
                }
                *(uint *)((long)local_200 + lVar29 * local_1b0 * 4 + lVar23 * 4) =
                     (uint)(bVar14 ^ 1);
                uVar20 = uVar20 + 1;
                pdVar22 = pdVar22 + local_170;
              } while (uVar20 != (uVar11 & 0x7fffffff));
            }
          }
          if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_160.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_160.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (int)((ulong)((long)local_b8.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_b8.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
        operator_delete(local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_198.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (ulong *)0x0;
      }
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_b8);
      sVar13 = local_1b0;
      if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        sVar13 = local_1b0;
      }
    }
    local_1b0 = sVar13;
    if (local_1c0 != (double *)0x0) {
      operator_delete(local_1c0,(long)local_1c8 - (long)local_1c0);
    }
    __return_storage_ptr__ = local_88;
    if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      __return_storage_ptr__ = local_88;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}